

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O2

_Bool ContainsValidUsAscii(char *asciiValue)

{
  char cVar1;
  
  while( true ) {
    if (asciiValue == (char *)0x0) {
      return true;
    }
    cVar1 = *asciiValue;
    if (cVar1 == '\0') break;
    asciiValue = asciiValue + 1;
    if ((byte)(cVar1 + 0x81U) < 0xa1) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool ContainsValidUsAscii(const char* asciiValue)
{
    bool result = true;
    const char* iterator = asciiValue;
    while (iterator != NULL && *iterator != '\0')
    {
        // Union of all allowed ASCII characters for the different protocols (HTTPS, MQTT, AMQP) is [dec 32, dec 126].
        if (*iterator < ' ' || *iterator > '~')
        {
            result = false;
            break;
        }
        iterator++;
    }

    return result;
}